

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-left-rotation.cpp
# Opt level: O0

void rotate(vector<int,_std::allocator<int>_> *xs,int shift)

{
  size_type sVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b8;
  int *local_b0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_a0;
  int *local_98;
  int *local_90;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  int *local_70;
  int *local_68;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  allocator<int> local_31;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> ys;
  int shift_local;
  vector<int,_std::allocator<int>_> *xs_local;
  
  ys.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
  ._4_4_ = shift;
  std::allocator<int>::allocator(&local_31);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,(long)shift,&local_31);
  std::allocator<int>::~allocator(&local_31);
  local_50._M_current = (int *)std::vector<int,_std::allocator<int>_>::cbegin(xs);
  local_60._M_current = (int *)std::vector<int,_std::allocator<int>_>::cbegin(xs);
  local_58 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator+(&local_60,
                       (long)ys.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_);
  local_68 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)local_30);
  local_70 = (int *)std::
                    copy<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              (local_50,local_58,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                               local_68);
  local_80._M_current = (int *)std::vector<int,_std::allocator<int>_>::cbegin(xs);
  local_78 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator+(&local_80,
                       (long)ys.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_);
  local_88._M_current = (int *)std::vector<int,_std::allocator<int>_>::cend(xs);
  local_90 = (int *)std::vector<int,_std::allocator<int>_>::begin(xs);
  local_98 = (int *)std::
                    copy<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              (local_78,local_88,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                               local_90);
  local_a0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::cbegin
                        ((vector<int,_std::allocator<int>_> *)local_30);
  local_a8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::cend
                        ((vector<int,_std::allocator<int>_> *)local_30);
  local_b8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(xs);
  sVar1 = std::vector<int,_std::allocator<int>_>::size(xs);
  local_b0 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(&local_b8,
                              sVar1 - (long)ys.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                            .super__Vector_impl_data._M_end_of_storage._4_4_);
  std::
  copy<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (local_a0,local_a8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_b0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return;
}

Assistant:

void rotate(std::vector<int> &xs, const int shift) {
  std::vector<int> ys(shift);
  std::copy(xs.cbegin(), xs.cbegin() + shift, ys.begin());
  std::copy(xs.cbegin() + shift, xs.cend(), xs.begin());
  std::copy(ys.cbegin(), ys.cend(), xs.begin() + (xs.size() - shift));
}